

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O1

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  pointer *ppuVar4;
  uint uVar5;
  pointer ppEVar6;
  pointer puVar7;
  Expr *expr;
  size_t sVar8;
  int iVar9;
  Result RVar10;
  pointer pSVar11;
  _func_int **pp_Var12;
  pointer piVar13;
  char *pcVar14;
  Index catch_index;
  iterator iVar15;
  
  pSVar11 = (this->state_stack_).
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar11) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar11;
  }
  ppEVar6 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar6) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar6;
  }
  piVar13 = (this->expr_iter_stack_).
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar13) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar13;
  }
  puVar7 = (this->catch_index_stack_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar7) {
    (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar7;
  }
  PushDefault(this,root_expr);
  pSVar11 = (this->state_stack_).
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != pSVar11) {
    do {
      if (Catch < pSVar11[-1]) goto LAB_0012ef52;
      expr = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
      switch(pSVar11[-1]) {
      case Default:
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        RVar10 = HandleDefaultState(this,expr);
        goto LAB_0012ef4d;
      case Block:
        if (expr->type_ != Block) {
          pcVar14 = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
          goto LAB_0012f022;
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str) {
LAB_0012ef73:
          __assert_fail("list_ == rhs.list_",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                        ,0xbf,
                        "bool wabt::intrusive_list<wabt::Expr>::iterator::operator!=(iterator) const [T = wabt::Expr]"
                       );
        }
        if (piVar13[-1].node_ != (Expr *)0x0) {
LAB_0012eeea:
          iVar15 = intrusive_list<wabt::Expr>::iterator::operator++(piVar13 + -1,0);
          if (iVar15.node_ == (Expr *)0x0) {
            __assert_fail("node_",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,0x99,
                          "reference wabt::intrusive_list<wabt::Expr>::iterator::operator*() const [T = wabt::Expr]"
                         );
          }
          PushDefault(this,iVar15.node_);
          goto LAB_0012ef52;
        }
        iVar9 = (*this->delegate_->_vptr_Delegate[4])();
        break;
      case IfTrue:
        if (expr->type_ != If) {
LAB_0012efb1:
          pcVar14 = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_0012f022:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                        ,0x4e,pcVar14);
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_0012ef73;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_0012eeea;
        iVar9 = (*this->delegate_->_vptr_Delegate[0x15])(this->delegate_,expr);
        if (iVar9 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        PushExprlist(this,IfFalse,expr,(ExprList *)&expr[4].loc);
        goto LAB_0012ef52;
      case IfFalse:
        if (expr->type_ != If) goto LAB_0012efb1;
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((Location *)piVar13[-1].list_ != &expr[4].loc) goto LAB_0012ef73;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_0012eeea;
        iVar9 = (*this->delegate_->_vptr_Delegate[0x16])();
        break;
      case Loop:
        if (expr->type_ != Loop) {
          pcVar14 = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
          ;
          goto LAB_0012f022;
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_0012ef73;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_0012eeea;
        iVar9 = (*this->delegate_->_vptr_Delegate[0x1c])();
        break;
      case Try:
        if (expr->type_ != Try) {
LAB_0012efc8:
          pcVar14 = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
          goto LAB_0012f022;
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_0012ef73;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_0012eeea;
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        iVar9 = *(int *)&expr->field_0x3c;
        if (iVar9 == 0) {
LAB_0012ef2d:
          pp_Var12 = this->delegate_->_vptr_Delegate;
        }
        else {
          if (iVar9 == 2) {
            RVar10.enum_ = (*this->delegate_->_vptr_Delegate[0x38])();
            goto LAB_0012ef4d;
          }
          if (iVar9 != 1) goto LAB_0012ef52;
          pcVar14 = (char *)expr[4].loc.filename._M_len;
          pp_Var12 = this->delegate_->_vptr_Delegate;
          if (pcVar14 != expr[4].loc.filename._M_str) {
            iVar9 = (*pp_Var12[0x37])(this->delegate_,expr,pcVar14);
            if (iVar9 == 1) {
              return (Result)Error;
            }
            catch_index = 0;
            goto LAB_0012eeb9;
          }
        }
        RVar10.enum_ = (*pp_Var12[0x39])();
LAB_0012ef4d:
        if (RVar10.enum_ == Error) {
          return (Result)Error;
        }
        goto LAB_0012ef52;
      case TryTable:
        if (expr->type_ != TryTable) {
          pcVar14 = "Derived *wabt::cast(Base *) [Derived = wabt::TryTableExpr, Base = wabt::Expr]";
          goto LAB_0012f022;
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_0012ef73;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_0012eeea;
        iVar9 = (*this->delegate_->_vptr_Delegate[9])();
        break;
      case Catch:
        if (expr->type_ != Try) goto LAB_0012efc8;
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar5 = (this->catch_index_stack_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        sVar8 = expr[4].loc.filename._M_len;
        if (piVar13[-1].list_ != (intrusive_list<wabt::Expr> *)((ulong)uVar5 * 0x80 + sVar8 + 0x68))
        goto LAB_0012ef73;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_0012eeea;
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        ppuVar4 = &(this->catch_index_stack_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar4 = *ppuVar4 + -1;
        catch_index = uVar5 + 1;
        if ((ulong)((long)((long)expr[4].loc.filename._M_str - sVar8) >> 7) <= (ulong)catch_index)
        goto LAB_0012ef2d;
        pcVar14 = (char *)(sVar8 + (ulong)catch_index * 0x80);
        iVar9 = (*this->delegate_->_vptr_Delegate[0x37])(this->delegate_,expr,pcVar14);
        if (iVar9 == 1) {
          return (Result)Error;
        }
LAB_0012eeb9:
        PushCatch(this,expr,catch_index,(ExprList *)(pcVar14 + 0x68));
        goto LAB_0012ef52;
      }
      if (iVar9 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
LAB_0012ef52:
      pSVar11 = (this->state_stack_).
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_start != pSVar11);
  }
  return (Result)Ok;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();
  catch_index_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::TryTable: {
        auto try_table_expr = cast<TryTableExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_table_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndTryTableExpr(try_table_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopExprlist();
          switch (try_expr->kind) {
            case TryKind::Catch:
              if (!try_expr->catches.empty()) {
                Catch& catch_ = try_expr->catches[0];
                CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
                PushCatch(expr, 0, catch_.exprs);
              } else {
                CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              }
              break;
            case TryKind::Delegate:
              CHECK_RESULT(delegate_->OnDelegateExpr(try_expr));
              break;
            case TryKind::Plain:
              CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              break;
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        Index catch_index = catch_index_stack_.back();
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catches[catch_index].exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopCatch();
          catch_index++;
          if (catch_index < try_expr->catches.size()) {
            Catch& catch_ = try_expr->catches[catch_index];
            CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
            PushCatch(expr, catch_index, catch_.exprs);
          } else {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          }
        }
        break;
      }
    }
  }

  return Result::Ok;
}